

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sigproc.cc
# Opt level: O0

void sptk::snack::xa_to_aca(float *a,float *b,float *c,int p)

{
  int j;
  int i;
  float *a0;
  float *ap;
  float s;
  int p_local;
  float *c_local;
  float *b_local;
  float *a_local;
  
  s = 1.0;
  i = p;
  ap = a;
  while (i != 0) {
    s = *ap * *ap + s;
    ap = ap + 1;
    i = i + -1;
  }
  *c = s;
  b_local = b;
  for (i = 1; i <= p; i = i + 1) {
    s = a[i + -1];
    j = p - i;
    a0 = a;
    ap = a + i;
    while (j != 0) {
      s = *a0 * *ap + s;
      j = j + -1;
      a0 = a0 + 1;
      ap = ap + 1;
    }
    *b_local = s * 2.0;
    b_local = b_local + 1;
  }
  return;
}

Assistant:

void xa_to_aca(float *a, float *b, float *c, int p)
#endif
{
  register float  s, *ap, *a0;
  register int  i, j;

  for ( s=1., ap=a, i = p; i--; ap++ )
    s += *ap * *ap;

  *c = s;
  for ( i = 1; i <= p; i++){
    s = a[i-1];
    for (a0 = a, ap = a+i, j = p-i; j--; )
      s += (*a0++ * *ap++);
    *b++ = (float) (2. * s);
  }

}